

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scgi_api.cpp
# Opt level: O2

void __thiscall cppcms::impl::cgi::scgi::on_first_read(scgi *this,error_code *e,size_t n,handler *h)

{
  pointer pcVar1;
  uint uVar2;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Var3;
  ulong uVar4;
  size_t n_00;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_> local_70;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_> local_68;
  undefined1 local_60 [16];
  mutable_buffer local_50;
  
  if (e->_M_value != 0) {
    booster::callback<void_(const_std::error_code_&)>::operator()(h,e);
    return;
  }
  pcVar1 = (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_50.super_buffer_impl<char_*>.size_ =
       CONCAT31(local_50.super_buffer_impl<char_*>.size_._1_3_,0x3a);
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (pcVar1,pcVar1 + n);
  pcVar1 = (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (long)_Var3._M_current - (long)pcVar1;
  this->sep_ = uVar4;
  if (uVar4 < 0x10) {
    pcVar1[uVar4] = '\0';
    uVar2 = atoi((this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start);
    if (uVar2 < 0x4001) {
      std::vector<char,_std::allocator<char>_>::resize(&this->buffer_,(ulong)uVar2 + this->sep_ + 2)
      ;
      pcVar1 = (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar4 = (long)(this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pcVar1;
      n_00 = uVar4 - n;
      if (n <= uVar4 && n_00 != 0) {
        booster::aio::buffer(&local_50,pcVar1 + n,n_00);
        self((scgi *)local_60);
        mfunc_to_io_handler<cppcms::impl::cgi::scgi,std::shared_ptr<cppcms::impl::cgi::scgi>,booster::callback<void(std::error_code_const&)>const&,booster::callback<void(std::error_code_const&)>>
                  ((offset_in_scgi_to_subr)&local_70,
                   (shared_ptr<cppcms::impl::cgi::scgi> *)on_headers_chunk_read,
                   (callback<void_(const_std::error_code_&)> *)0x0);
        booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
        intrusive_ptr(&local_68,&local_70);
        booster::aio::stream_socket::async_read
                  ((mutable_buffer *)&this->socket_,(callback *)&local_50);
        booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
        ~intrusive_ptr(&local_68);
        booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
        ~intrusive_ptr(&local_70);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
        std::
        _Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
        ::~_Vector_base(&local_50.super_buffer_impl<char_*>.vec_.
                         super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                       );
        return;
      }
    }
  }
  local_50.super_buffer_impl<char_*>.size_ = 1;
  local_50.super_buffer_impl<char_*>.entry_.ptr = (char *)&cppcms_category;
  booster::callback<void_(const_std::error_code_&)>::operator()(h,(error_code *)&local_50);
  return;
}

Assistant:

void on_first_read(booster::system::error_code const &e,size_t n,handler const &h)
		{
			if(e) {
				h(e);
				return;
			}
			sep_=std::find(buffer_.begin(),buffer_.begin()+n,':') - buffer_.begin();
			if(sep_ >= 16) {
				h(booster::system::error_code(errc::protocol_violation,cppcms_category));
				return;
			}
			buffer_[sep_]=0;
			int len=atoi(&buffer_.front());
			if(len < 0 || 16384 < len) {
				h(booster::system::error_code(errc::protocol_violation,cppcms_category));
				return;
			}
			size_t size=n;
			buffer_.resize(sep_ + 2 + len); // len of number + ':' + content + ','
			if(buffer_.size() <= size) {
				// It can't be so short so
				h(booster::system::error_code(errc::protocol_violation,cppcms_category));
				return;
			}
			socket_.async_read(
				io::buffer(&buffer_[size],buffer_.size() - size),
					mfunc_to_io_handler(
						&scgi::on_headers_chunk_read,
						self(),
						h));
		}